

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O3

SMF * SMF_NewFromFile(char *path,LPStatus *status)

{
  _Bool _Var1;
  LPStatus LVar2;
  FILE *__stream;
  SMF *pSVar3;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    LVar2 = LUNAPURPURA_CANTOPENFILE;
    pSVar3 = (SMF *)0x0;
  }
  else {
    _Var1 = ValidateMagicF((FILE *)__stream,SMF_MAGIC,4);
    pSVar3 = (SMF *)0x0;
    if (_Var1) {
      pSVar3 = (SMF *)malloc(8);
      fclose(__stream);
      LVar2 = LUNAPURPURA_OK;
    }
    else {
      LVar2 = LUNAPURPURA_BADMAGIC;
    }
  }
  *status = LVar2;
  return pSVar3;
}

Assistant:

SMF *
SMF_NewFromFile(const char *path, LPStatus *status)
{
	FILE *f = fopen(path, "rb");

	if (!f) {
		*status = LUNAPURPURA_CANTOPENFILE;
		return NULL;
	}

	if (!ValidateMagicF(f, SMF_MAGIC, SMF_MAGIC_LEN)) {
		*status = LUNAPURPURA_BADMAGIC;
		return NULL;
	}

	SMF *smf = malloc(sizeof(SMF)); /* XXX error check */

	fclose(f);

	*status = LUNAPURPURA_OK;
	return smf;
}